

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

ITestingV1 * trun::TestResponseProxy::GetTRTestInterfaceV1(void)

{
  return &GetTRTestInterfaceV1::trp_bridge_v1;
}

Assistant:

ITestingV1 *TestResponseProxy::GetTRTestInterfaceV1() {
    static ITestingV1 trp_bridge_v1 = {
            .Debug = int_trp_debug,
            .Info = int_trp_info,
            .Warning = int_trp_warning,
            .Error = int_trp_error,
            .Fatal = int_trp_fatal,
            .Abort = int_trp_abort,
            .AssertError = int_trp_assert_error,
            .SetPreCaseCallback = int_trp_hook_precase_v1,
            .SetPostCaseCallback = int_trp_hook_postcase_v1,
            .CaseDepends = int_trp_casedepend,
    };
    return &trp_bridge_v1;
}